

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 crnd::utils::compute_max_mips(uint32 width,uint32 height)

{
  uint32 local_18;
  uint local_14;
  uint32 num_mips;
  uint32 height_local;
  uint32 width_local;
  
  if (width == 0 && height == 0) {
    height_local = 0;
  }
  else {
    local_18 = 1;
    local_14 = height;
    for (num_mips = width; 1 < num_mips || 1 < local_14; num_mips = num_mips >> 1) {
      local_14 = local_14 >> 1;
      local_18 = local_18 + 1;
    }
    height_local = local_18;
  }
  return height_local;
}

Assistant:

uint32 compute_max_mips(uint32 width, uint32 height)
        {
            if ((width | height) == 0)
                return 0;

            uint32 num_mips = 1;

            while ((width > 1U) || (height > 1U))
            {
                width >>= 1U;
                height >>= 1U;
                num_mips++;
            }

            return num_mips;
        }